

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTextureImplFBO.cpp
# Opt level: O3

void __thiscall sf::priv::RenderTextureImplFBO::~RenderTextureImplFBO(RenderTextureImplFBO *this)

{
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  Context *this_00;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::_Rb_tree_iterator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  pVar4;
  TransientContextLock contextLock;
  GLuint colorBuffer;
  Lock lock;
  TransientContextLock local_51;
  pair<unsigned_long_long,_unsigned_int> local_50;
  map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  *local_40;
  Lock local_38;
  
  (this->super_RenderTextureImpl)._vptr_RenderTextureImpl =
       (_func_int **)&PTR__RenderTextureImplFBO_0027d8d8;
  GlResource::TransientContextLock::TransientContextLock(&local_51);
  Lock::Lock(&local_38,(Mutex *)&(anonymous_namespace)::mutex);
  local_50.first = (unsigned_long_long)&this->m_frameBuffers;
  pVar4 = std::
          _Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
          ::equal_range((_Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
                         *)(anonymous_namespace)::frameBuffers,(key_type *)&local_50);
  std::
  _Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  ::_M_erase_aux((_Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
                  *)(anonymous_namespace)::frameBuffers,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  pmVar1 = &this->m_multisampleFrameBuffers;
  local_50.first = (unsigned_long_long)pmVar1;
  pVar4 = std::
          _Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
          ::equal_range((_Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
                         *)(anonymous_namespace)::frameBuffers,(key_type *)&local_50);
  std::
  _Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
  ::_M_erase_aux((_Rb_tree<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*,_std::_Identity<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::less<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>,_std::allocator<std::map<unsigned_long_long,_unsigned_int,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>_*>_>
                  *)(anonymous_namespace)::frameBuffers,(_Base_ptr)pVar4.first._M_node,
                 (_Base_ptr)pVar4.second._M_node);
  if (this->m_colorBuffer != 0) {
    local_50.first = CONCAT44(local_50.first._4_4_,this->m_colorBuffer);
    (*sf_glad_glDeleteRenderbuffersEXT)(1,(GLuint *)&local_50);
  }
  if (this->m_depthStencilBuffer != 0) {
    local_50.first = CONCAT44(local_50.first._4_4_,this->m_depthStencilBuffer);
    (*sf_glad_glDeleteRenderbuffersEXT)(1,(GLuint *)&local_50);
  }
  p_Var3 = (this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_frameBuffers)._M_t._M_impl.super__Rb_tree_header;
  local_40 = pmVar1;
  if ((_Rb_tree_header *)p_Var3 != p_Var2) {
    do {
      local_50.first = *(unsigned_long_long *)(p_Var3 + 1);
      local_50.second = *(uint *)&p_Var3[1]._M_parent;
      std::
      _Rb_tree<std::pair<unsigned_long_long,unsigned_int>,std::pair<unsigned_long_long,unsigned_int>,std::_Identity<std::pair<unsigned_long_long,unsigned_int>>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
      ::_M_insert_unique<std::pair<unsigned_long_long,unsigned_int>>
                ((_Rb_tree<std::pair<unsigned_long_long,unsigned_int>,std::pair<unsigned_long_long,unsigned_int>,std::_Identity<std::pair<unsigned_long_long,unsigned_int>>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
                  *)(anonymous_namespace)::staleFrameBuffers,&local_50);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var2);
  }
  p_Var3 = (this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_multisampleFrameBuffers)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var2) {
    do {
      local_50.first = *(unsigned_long_long *)(p_Var3 + 1);
      local_50.second = *(uint *)&p_Var3[1]._M_parent;
      std::
      _Rb_tree<std::pair<unsigned_long_long,unsigned_int>,std::pair<unsigned_long_long,unsigned_int>,std::_Identity<std::pair<unsigned_long_long,unsigned_int>>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
      ::_M_insert_unique<std::pair<unsigned_long_long,unsigned_int>>
                ((_Rb_tree<std::pair<unsigned_long_long,unsigned_int>,std::pair<unsigned_long_long,unsigned_int>,std::_Identity<std::pair<unsigned_long_long,unsigned_int>>,std::less<std::pair<unsigned_long_long,unsigned_int>>,std::allocator<std::pair<unsigned_long_long,unsigned_int>>>
                  *)(anonymous_namespace)::staleFrameBuffers,&local_50);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var2);
  }
  anon_unknown.dwarf_53cd95::destroyStaleFBOs();
  pmVar1 = local_40;
  this_00 = this->m_context;
  if (this_00 != (Context *)0x0) {
    Context::~Context(this_00);
  }
  operator_delete(this_00);
  Lock::~Lock(&local_38);
  GlResource::TransientContextLock::~TransientContextLock(&local_51);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_int>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::~_Rb_tree(&pmVar1->_M_t);
  std::
  _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_unsigned_int>,_std::_Select1st<std::pair<const_unsigned_long_long,_unsigned_int>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_unsigned_int>_>_>
  ::~_Rb_tree(&(this->m_frameBuffers)._M_t);
  GlResource::~GlResource((GlResource *)this);
  RenderTextureImpl::~RenderTextureImpl(&this->super_RenderTextureImpl);
  return;
}

Assistant:

RenderTextureImplFBO::~RenderTextureImplFBO()
{
    TransientContextLock contextLock;

    Lock lock(mutex);

    // Remove the frame buffer mapping from the set of all active mappings
    frameBuffers.erase(&m_frameBuffers);
    frameBuffers.erase(&m_multisampleFrameBuffers);

    // Destroy the color buffer
    if (m_colorBuffer)
    {
        GLuint colorBuffer = m_colorBuffer;
        glCheck(GLEXT_glDeleteRenderbuffers(1, &colorBuffer));
    }

    // Destroy the depth/stencil buffer
    if (m_depthStencilBuffer)
    {
        GLuint depthStencilBuffer = m_depthStencilBuffer;
        glCheck(GLEXT_glDeleteRenderbuffers(1, &depthStencilBuffer));
    }

    // Move all frame buffer objects to stale set
    for (std::map<Uint64, unsigned int>::iterator iter = m_frameBuffers.begin(); iter != m_frameBuffers.end(); ++iter)
        staleFrameBuffers.insert(std::make_pair(iter->first, iter->second));

    for (std::map<Uint64, unsigned int>::iterator iter = m_multisampleFrameBuffers.begin(); iter != m_multisampleFrameBuffers.end(); ++iter)
        staleFrameBuffers.insert(std::make_pair(iter->first, iter->second));

    // Clean up FBOs
    destroyStaleFBOs();

    // Delete the backup context if we had to create one
    delete m_context;
}